

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  uint uVar14;
  ulong uVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  vint4 bi_2;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  vint4 bi_4;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vfloat4 a0;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai_7;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_4;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  vfloat<4> tNear;
  vint4 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  RayHit *local_1120;
  Intersectors *local_1118;
  RayQueryContext *local_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1110 = context;
  local_1118 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar27 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar33 = vrsqrtss_avx(auVar27,auVar27);
    fVar25 = auVar33._0_4_;
    local_fb8[0] = fVar25 * 1.5 - auVar27._0_4_ * 0.5 * fVar25 * fVar25 * fVar25;
    local_1038 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uStack_1034 = local_1038;
    uStack_1030 = local_1038;
    uStack_102c = local_1038;
    local_1048 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uStack_1044 = local_1048;
    uStack_1040 = local_1048;
    uStack_103c = local_1048;
    local_1058 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    auVar43._0_4_ = aVar1.x * local_fb8[0];
    auVar43._4_4_ = aVar1.y * local_fb8[0];
    auVar43._8_4_ = aVar1.z * local_fb8[0];
    auVar43._12_4_ = aVar1.field_3.w * local_fb8[0];
    auVar33 = vshufpd_avx(auVar43,auVar43,1);
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar27 = vmovshdup_avx(auVar43);
    auVar55._0_4_ = auVar27._0_4_ ^ 0x80000000;
    auVar48 = ZEXT816(0) << 0x40;
    auVar27 = vunpckhps_avx(auVar43,auVar48);
    auVar55._4_12_ = ZEXT812(0) << 0x20;
    auVar47 = vshufps_avx(auVar27,auVar55,0x41);
    auVar50._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
    auVar50._8_8_ = auVar33._8_8_ ^ auVar23._8_8_;
    auVar23 = vinsertps_avx(auVar50,auVar43,0x2a);
    auVar27 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar33 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar27 = vcmpps_avx(auVar33,auVar27,1);
    auVar58._0_4_ = auVar27._0_4_;
    auVar58._4_4_ = auVar58._0_4_;
    auVar58._8_4_ = auVar58._0_4_;
    auVar58._12_4_ = auVar58._0_4_;
    auVar27 = vblendvps_avx(auVar23,auVar47,auVar58);
    auVar33 = vdpps_avx(auVar27,auVar27,0x7f);
    auVar23 = vrsqrtss_avx(auVar33,auVar33);
    fVar25 = auVar23._0_4_;
    fVar25 = fVar25 * 1.5 - auVar33._0_4_ * 0.5 * fVar25 * fVar25 * fVar25;
    auVar47._0_4_ = auVar27._0_4_ * fVar25;
    auVar47._4_4_ = auVar27._4_4_ * fVar25;
    auVar47._8_4_ = auVar27._8_4_ * fVar25;
    auVar47._12_4_ = auVar27._12_4_ * fVar25;
    auVar27 = vshufps_avx(auVar47,auVar47,0xc9);
    auVar33 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar56._0_4_ = auVar33._0_4_ * auVar47._0_4_;
    auVar56._4_4_ = auVar33._4_4_ * auVar47._4_4_;
    auVar56._8_4_ = auVar33._8_4_ * auVar47._8_4_;
    auVar56._12_4_ = auVar33._12_4_ * auVar47._12_4_;
    auVar27 = vfmsub231ps_fma(auVar56,auVar43,auVar27);
    auVar23 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar27 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar33 = vrsqrtss_avx(auVar27,auVar27);
    fVar25 = auVar33._0_4_;
    fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * fVar25 * auVar27._0_4_ * 0.5;
    auVar33._0_4_ = fVar25 * auVar23._0_4_;
    auVar33._4_4_ = fVar25 * auVar23._4_4_;
    auVar33._8_4_ = fVar25 * auVar23._8_4_;
    auVar33._12_4_ = fVar25 * auVar23._12_4_;
    auVar27._0_4_ = local_fb8[0] * auVar43._0_4_;
    auVar27._4_4_ = local_fb8[0] * auVar43._4_4_;
    auVar27._8_4_ = local_fb8[0] * auVar43._8_4_;
    auVar27._12_4_ = local_fb8[0] * auVar43._12_4_;
    auVar23 = vunpcklps_avx(auVar47,auVar27);
    auVar27 = vunpckhps_avx(auVar47,auVar27);
    auVar47 = vunpcklps_avx(auVar33,auVar48);
    auVar33 = vunpckhps_avx(auVar33,auVar48);
    local_f88 = vunpcklps_avx(auVar27,auVar33);
    local_fa8 = vunpcklps_avx(auVar23,auVar47);
    local_f98 = vunpckhps_avx(auVar23,auVar47);
    uStack_f70 = 0;
    auVar33 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar23 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    local_1068._8_4_ = 0x7fffffff;
    local_1068._0_8_ = 0x7fffffff7fffffff;
    local_1068._12_4_ = 0x7fffffff;
    auVar27 = vandps_avx((undefined1  [16])aVar1,local_1068);
    auVar51._8_4_ = 0x219392ef;
    auVar51._0_8_ = 0x219392ef219392ef;
    auVar51._12_4_ = 0x219392ef;
    auVar27 = vcmpps_avx(auVar27,auVar51,1);
    auVar27 = vblendvps_avx((undefined1  [16])aVar1,auVar51,auVar27);
    auVar47 = vrcpps_avx(auVar27);
    auVar48._8_4_ = 0x3f800000;
    auVar48._0_8_ = 0x3f8000003f800000;
    auVar48._12_4_ = 0x3f800000;
    auVar27 = vfnmadd213ps_fma(auVar27,auVar47,auVar48);
    auVar48 = vfmadd132ps_fma(auVar27,auVar47,auVar47);
    fVar25 = auVar48._0_4_;
    local_1078 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uStack_1074 = local_1078;
    uStack_1070 = local_1078;
    uStack_106c = local_1078;
    auVar27 = vmovshdup_avx(auVar48);
    auVar47 = vshufpd_avx(auVar48,auVar48,1);
    auVar52._0_4_ = fVar25 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar52._4_4_ = auVar48._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar52._8_4_ = auVar48._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar52._12_4_ = auVar48._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    uVar22 = (ulong)(fVar25 < 0.0) * 0x10;
    uVar21 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
    local_10a8._4_4_ = fVar25;
    local_10a8._0_4_ = fVar25;
    local_10a8._8_4_ = fVar25;
    local_10a8._12_4_ = fVar25;
    auVar57 = ZEXT1664(local_10a8);
    auVar27 = vshufps_avx(auVar52,auVar52,0x55);
    auVar43 = vshufps_avx(auVar52,auVar52,0xaa);
    uVar20 = CONCAT44(auVar52._0_4_,auVar52._0_4_);
    local_10b8._0_8_ = uVar20 ^ 0x8000000080000000;
    local_10b8._8_4_ = -auVar52._0_4_;
    local_10b8._12_4_ = -auVar52._0_4_;
    auVar54 = ZEXT1664(local_10b8);
    local_10c8._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
    local_10c8._8_4_ = auVar27._8_4_ ^ 0x80000000;
    local_10c8._12_4_ = auVar27._12_4_ ^ 0x80000000;
    auVar59 = ZEXT1664(local_10c8);
    local_10d8._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
    local_10d8._8_4_ = auVar43._8_4_ ^ 0x80000000;
    local_10d8._12_4_ = auVar43._12_4_ ^ 0x80000000;
    auVar60 = ZEXT1664(local_10d8);
    local_10e8 = vshufps_avx(auVar48,auVar48,0x55);
    auVar62 = ZEXT1664(local_10e8);
    local_10f8 = vshufps_avx(auVar48,auVar48,0xaa);
    auVar64 = ZEXT1664(local_10f8);
    uVar20 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x40;
    uVar32 = auVar33._0_4_;
    local_1108._4_4_ = uVar32;
    local_1108._0_4_ = uVar32;
    local_1108._8_4_ = uVar32;
    local_1108._12_4_ = uVar32;
    auVar65 = ZEXT1664(local_1108);
    uVar32 = auVar23._0_4_;
    auVar24 = ZEXT1664(CONCAT412(uVar32,CONCAT48(uVar32,CONCAT44(uVar32,uVar32))));
    local_1088 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uStack_1084 = local_1088;
    uStack_1080 = local_1088;
    uStack_107c = local_1088;
    local_1098 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uStack_1094 = local_1098;
    uStack_1090 = local_1098;
    uStack_108c = local_1098;
    local_1120 = ray;
    pauVar19 = (undefined1 (*) [16])local_f68;
LAB_0147a027:
    if (pauVar19 != (undefined1 (*) [16])&local_f78) {
      pauVar13 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)(*pauVar13 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar15 = *(ulong *)*pauVar19;
        while ((uVar15 & 8) == 0) {
          fVar25 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar14 = (uint)uVar15 & 7;
          uVar16 = uVar15 & 0xfffffffffffffff0;
          if (uVar14 == 3) {
            local_1008 = *(undefined1 (*) [16])(uVar16 + 0x20);
            local_1018 = *(undefined1 (*) [16])(uVar16 + 0x50);
            local_ff8 = *(undefined1 (*) [16])(uVar16 + 0x60);
            auVar58 = *(undefined1 (*) [16])(uVar16 + 0x70);
            local_1028 = *(undefined8 *)*(undefined1 (*) [16])(uVar16 + 0x70);
            uStack_1020 = *(undefined8 *)(uVar16 + 0x78);
            auVar27 = *(undefined1 (*) [16])(uVar16 + 0x80);
            auVar33 = *(undefined1 (*) [16])(uVar16 + 0x90);
            fStack_fbc = 1.0 - fVar25;
            auVar61._0_4_ = fVar25 * *(float *)(uVar16 + 0xe0);
            auVar61._4_4_ = fVar25 * *(float *)(uVar16 + 0xe4);
            auVar61._8_4_ = fVar25 * *(float *)(uVar16 + 0xe8);
            auVar61._12_4_ = fVar25 * *(float *)(uVar16 + 0xec);
            auVar63._0_4_ = fVar25 * *(float *)(uVar16 + 0xf0);
            auVar63._4_4_ = fVar25 * *(float *)(uVar16 + 0xf4);
            auVar63._8_4_ = fVar25 * *(float *)(uVar16 + 0xf8);
            auVar63._12_4_ = fVar25 * *(float *)(uVar16 + 0xfc);
            auVar44._0_4_ = fVar25 * *(float *)(uVar16 + 0x100);
            auVar44._4_4_ = fVar25 * *(float *)(uVar16 + 0x104);
            auVar44._8_4_ = fVar25 * *(float *)(uVar16 + 0x108);
            auVar44._12_4_ = fVar25 * *(float *)(uVar16 + 0x10c);
            auVar28._4_4_ = fStack_fbc;
            auVar28._0_4_ = fStack_fbc;
            auVar28._8_4_ = fStack_fbc;
            auVar28._12_4_ = fStack_fbc;
            auVar37._0_12_ = ZEXT812(0);
            auVar37._12_4_ = 0;
            auVar55 = vfmadd231ps_fma(auVar61,auVar28,auVar37);
            auVar56 = vfmadd231ps_fma(auVar63,auVar28,auVar37);
            local_1138 = vfmadd231ps_fma(auVar44,auVar28,auVar37);
            local_fe8 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x110);
            fStack_fe4 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x114);
            fStack_fe0 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x118);
            fStack_fdc = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x11c);
            local_fd8 = fVar25 * *(float *)(uVar16 + 0x120) + fStack_fbc;
            fStack_fd4 = fVar25 * *(float *)(uVar16 + 0x124) + fStack_fbc;
            fStack_fd0 = fVar25 * *(float *)(uVar16 + 0x128) + fStack_fbc;
            fStack_fcc = fVar25 * *(float *)(uVar16 + 300) + fStack_fbc;
            local_fc8 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x130);
            fStack_fc4 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x134);
            fStack_fc0 = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x138);
            fStack_fbc = fStack_fbc + fVar25 * *(float *)(uVar16 + 0x13c);
            auVar29._0_4_ = local_1058 * auVar27._0_4_;
            auVar29._4_4_ = fStack_1054 * auVar27._4_4_;
            auVar29._8_4_ = fStack_1050 * auVar27._8_4_;
            auVar29._12_4_ = fStack_104c * auVar27._12_4_;
            auVar34._0_4_ = local_1058 * auVar33._0_4_;
            auVar34._4_4_ = fStack_1054 * auVar33._4_4_;
            auVar34._8_4_ = fStack_1050 * auVar33._8_4_;
            auVar34._12_4_ = fStack_104c * auVar33._12_4_;
            auVar8._4_4_ = uStack_1044;
            auVar8._0_4_ = local_1048;
            auVar8._8_4_ = uStack_1040;
            auVar8._12_4_ = uStack_103c;
            auVar23 = vfmadd231ps_fma(auVar29,auVar8,local_1018);
            auVar47 = vfmadd231ps_fma(auVar34,auVar8,local_ff8);
            auVar9._4_4_ = uStack_1034;
            auVar9._0_4_ = local_1038;
            auVar9._8_4_ = uStack_1030;
            auVar9._12_4_ = uStack_102c;
            auVar43 = vfmadd231ps_fma(auVar23,auVar9,local_1008);
            auVar47 = vfmadd231ps_fma(auVar47,auVar9,*(undefined1 (*) [16])(uVar16 + 0x30));
            auVar23 = vandps_avx(auVar43,local_1068);
            auVar41._8_4_ = 0x219392ef;
            auVar41._0_8_ = 0x219392ef219392ef;
            auVar41._12_4_ = 0x219392ef;
            auVar23 = vcmpps_avx(auVar23,auVar41,1);
            auVar43 = vblendvps_avx(auVar43,auVar41,auVar23);
            auVar23 = vandps_avx(auVar47,local_1068);
            auVar23 = vcmpps_avx(auVar23,auVar41,1);
            auVar48 = vblendvps_avx(auVar47,auVar41,auVar23);
            auVar23 = *(undefined1 (*) [16])(uVar16 + 0xa0);
            auVar35._0_4_ = local_1058 * auVar23._0_4_;
            auVar35._4_4_ = fStack_1054 * auVar23._4_4_;
            auVar35._8_4_ = fStack_1050 * auVar23._8_4_;
            auVar35._12_4_ = fStack_104c * auVar23._12_4_;
            auVar47 = vfmadd231ps_fma(auVar35,auVar8,auVar58);
            auVar50 = vfmadd231ps_fma(auVar47,auVar9,*(undefined1 (*) [16])(uVar16 + 0x40));
            auVar47 = vandps_avx(auVar50,local_1068);
            auVar47 = vcmpps_avx(auVar47,auVar41,1);
            auVar47 = vblendvps_avx(auVar50,auVar41,auVar47);
            auVar50 = vrcpps_avx(auVar43);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar43 = vfnmadd213ps_fma(auVar43,auVar50,auVar38);
            auVar50 = vfmadd132ps_fma(auVar43,auVar50,auVar50);
            auVar43 = vrcpps_avx(auVar48);
            auVar48 = vfnmadd213ps_fma(auVar48,auVar43,auVar38);
            auVar51 = vfmadd132ps_fma(auVar48,auVar43,auVar43);
            auVar43 = vrcpps_avx(auVar47);
            auVar47 = vfnmadd213ps_fma(auVar47,auVar43,auVar38);
            auVar52 = vfmadd132ps_fma(auVar47,auVar43,auVar43);
            auVar65 = ZEXT1664(local_1108);
            auVar5._4_4_ = uStack_1094;
            auVar5._0_4_ = local_1098;
            auVar5._8_4_ = uStack_1090;
            auVar5._12_4_ = uStack_108c;
            auVar27 = vfmadd213ps_fma(auVar27,auVar5,*(undefined1 (*) [16])(uVar16 + 0xb0));
            auVar6._4_4_ = uStack_1084;
            auVar6._0_4_ = local_1088;
            auVar6._8_4_ = uStack_1080;
            auVar6._12_4_ = uStack_107c;
            auVar47 = vfmadd231ps_fma(auVar27,auVar6,local_1018);
            auVar27 = vfmadd213ps_fma(auVar33,auVar5,*(undefined1 (*) [16])(uVar16 + 0xc0));
            auVar33 = vfmadd213ps_fma(auVar23,auVar5,*(undefined1 (*) [16])(uVar16 + 0xd0));
            auVar27 = vfmadd231ps_fma(auVar27,auVar6,local_ff8);
            auVar33 = vfmadd231ps_fma(auVar33,auVar6,auVar58);
            auVar7._4_4_ = uStack_1074;
            auVar7._0_4_ = local_1078;
            auVar7._8_4_ = uStack_1070;
            auVar7._12_4_ = uStack_106c;
            auVar23 = vfmadd231ps_fma(auVar47,auVar7,local_1008);
            auVar47 = vfmadd231ps_fma(auVar27,auVar7,*(undefined1 (*) [16])(uVar16 + 0x30));
            auVar48 = vfmadd231ps_fma(auVar33,auVar7,*(undefined1 (*) [16])(uVar16 + 0x40));
            auVar27 = vsubps_avx(auVar55,auVar23);
            auVar60 = ZEXT1664(local_10d8);
            auVar10._4_4_ = fStack_fe4;
            auVar10._0_4_ = local_fe8;
            auVar10._8_4_ = fStack_fe0;
            auVar10._12_4_ = fStack_fdc;
            auVar33 = vsubps_avx(auVar10,auVar23);
            auVar23 = vsubps_avx(auVar56,auVar47);
            auVar62 = ZEXT1664(local_10e8);
            auVar11._4_4_ = fStack_fd4;
            auVar11._0_4_ = local_fd8;
            auVar11._8_4_ = fStack_fd0;
            auVar11._12_4_ = fStack_fcc;
            auVar47 = vsubps_avx(auVar11,auVar47);
            auVar59 = ZEXT1664(local_10c8);
            auVar43 = vsubps_avx(local_1138,auVar48);
            auVar64 = ZEXT1664(local_10f8);
            auVar12._4_4_ = fStack_fc4;
            auVar12._0_4_ = local_fc8;
            auVar12._8_4_ = fStack_fc0;
            auVar12._12_4_ = fStack_fbc;
            auVar48 = vsubps_avx(auVar12,auVar48);
            auVar45._0_4_ = auVar50._0_4_ * auVar27._0_4_;
            auVar45._4_4_ = auVar50._4_4_ * auVar27._4_4_;
            auVar45._8_4_ = auVar50._8_4_ * auVar27._8_4_;
            auVar45._12_4_ = auVar50._12_4_ * auVar27._12_4_;
            auVar39._0_4_ = auVar50._0_4_ * auVar33._0_4_;
            auVar39._4_4_ = auVar50._4_4_ * auVar33._4_4_;
            auVar39._8_4_ = auVar50._8_4_ * auVar33._8_4_;
            auVar39._12_4_ = auVar50._12_4_ * auVar33._12_4_;
            auVar49._0_4_ = auVar51._0_4_ * auVar23._0_4_;
            auVar49._4_4_ = auVar51._4_4_ * auVar23._4_4_;
            auVar49._8_4_ = auVar51._8_4_ * auVar23._8_4_;
            auVar49._12_4_ = auVar51._12_4_ * auVar23._12_4_;
            auVar53._0_4_ = auVar43._0_4_ * auVar52._0_4_;
            auVar53._4_4_ = auVar43._4_4_ * auVar52._4_4_;
            auVar53._8_4_ = auVar43._8_4_ * auVar52._8_4_;
            auVar53._12_4_ = auVar43._12_4_ * auVar52._12_4_;
            auVar42._0_4_ = auVar51._0_4_ * auVar47._0_4_;
            auVar42._4_4_ = auVar51._4_4_ * auVar47._4_4_;
            auVar42._8_4_ = auVar51._8_4_ * auVar47._8_4_;
            auVar42._12_4_ = auVar51._12_4_ * auVar47._12_4_;
            auVar30._0_4_ = auVar48._0_4_ * auVar52._0_4_;
            auVar30._4_4_ = auVar48._4_4_ * auVar52._4_4_;
            auVar30._8_4_ = auVar48._8_4_ * auVar52._8_4_;
            auVar30._12_4_ = auVar48._12_4_ * auVar52._12_4_;
            auVar27 = vpminsd_avx(auVar49,auVar42);
            auVar33 = vpminsd_avx(auVar53,auVar30);
            auVar27 = vmaxps_avx(auVar27,auVar33);
            auVar43 = vpminsd_avx(auVar45,auVar39);
            auVar47 = vpmaxsd_avx(auVar45,auVar39);
            auVar33 = vpmaxsd_avx(auVar49,auVar42);
            auVar23 = vpmaxsd_avx(auVar53,auVar30);
            auVar54 = ZEXT1664(local_10b8);
            auVar23 = vminps_avx(auVar33,auVar23);
            auVar33 = vmaxps_avx(local_1108,auVar43);
            auVar57 = ZEXT1664(local_10a8);
            local_1148 = vmaxps_avx(auVar33,auVar27);
            auVar27 = vminps_avx(auVar24._0_16_,auVar47);
            auVar27 = vminps_avx(auVar27,auVar23);
            auVar27 = vcmpps_avx(local_1148,auVar27,2);
            uVar14 = vmovmskps_avx(auVar27);
          }
          else {
            auVar26._4_4_ = fVar25;
            auVar26._0_4_ = fVar25;
            auVar26._8_4_ = fVar25;
            auVar26._12_4_ = fVar25;
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar22),auVar26,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar22));
            auVar27 = vfmadd213ps_fma(auVar27,auVar57._0_16_,auVar54._0_16_);
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar21),auVar26,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar21));
            auVar33 = vfmadd213ps_fma(auVar33,auVar62._0_16_,auVar59._0_16_);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar20),auVar26,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar20));
            auVar27 = vpmaxsd_avx(auVar27,auVar33);
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar22 ^ 0x10)),
                                      auVar26,*(undefined1 (*) [16])
                                               (uVar16 + 0x20 + (uVar22 ^ 0x10)));
            auVar47 = vfmadd213ps_fma(auVar23,auVar64._0_16_,auVar60._0_16_);
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar21 ^ 0x10)),
                                      auVar26,*(undefined1 (*) [16])
                                               (uVar16 + 0x20 + (uVar21 ^ 0x10)));
            auVar33 = vfmadd213ps_fma(auVar33,auVar57._0_16_,auVar54._0_16_);
            auVar23 = vfmadd213ps_fma(auVar23,auVar62._0_16_,auVar59._0_16_);
            auVar23 = vpminsd_avx(auVar33,auVar23);
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar20 ^ 0x10)),
                                      auVar26,*(undefined1 (*) [16])
                                               (uVar16 + 0x20 + (uVar20 ^ 0x10)));
            auVar43 = vfmadd213ps_fma(auVar33,auVar64._0_16_,auVar60._0_16_);
            auVar33 = vpmaxsd_avx(auVar47,auVar65._0_16_);
            local_1148 = vpmaxsd_avx(auVar27,auVar33);
            auVar27 = vpminsd_avx(auVar43,auVar24._0_16_);
            auVar27 = vpminsd_avx(auVar23,auVar27);
            if (uVar14 == 6) {
              auVar33 = vcmpps_avx(local_1148,auVar27,2);
              auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar26,2);
              auVar23 = vcmpps_avx(auVar26,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
              auVar27 = vandps_avx(auVar27,auVar23);
              auVar27 = vandps_avx(auVar27,auVar33);
            }
            else {
              auVar27 = vcmpps_avx(local_1148,auVar27,2);
            }
            auVar27 = vpslld_avx(auVar27,0x1f);
            uVar14 = vmovmskps_avx(auVar27);
          }
          uVar15 = (ulong)uVar14;
          if (uVar15 == 0) goto LAB_0147a027;
          lVar4 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar4 = lVar4 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar17 = (ulong)uVar14;
          uVar15 = *(ulong *)(uVar16 + lVar4 * 8);
          if (uVar14 != 0) {
            uVar2 = *(uint *)(local_1148 + lVar4 * 4);
            lVar4 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar4 = lVar4 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar18 = (ulong)uVar14;
            uVar17 = *(ulong *)(uVar16 + lVar4 * 8);
            uVar3 = *(uint *)(local_1148 + lVar4 * 4);
            if (uVar14 == 0) {
              if (uVar2 < uVar3) {
                *(ulong *)*pauVar19 = uVar17;
                *(uint *)(*pauVar19 + 8) = uVar3;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar15;
                *(uint *)(*pauVar19 + 8) = uVar2;
                uVar15 = uVar17;
                pauVar19 = pauVar19 + 1;
              }
            }
            else {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar15;
              auVar27 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar2));
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar17;
              auVar33 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
              lVar4 = 0;
              for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar4 = lVar4 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar15 = (ulong)uVar14;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(uVar16 + lVar4 * 8);
              auVar47 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_1148 + lVar4 * 4)));
              auVar23 = vpcmpgtd_avx(auVar33,auVar27);
              if (uVar14 == 0) {
                auVar43 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar33,auVar27,auVar43);
                auVar27 = vblendvps_avx(auVar27,auVar33,auVar43);
                auVar33 = vpcmpgtd_avx(auVar47,auVar23);
                auVar43 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar47,auVar23,auVar43);
                auVar23 = vblendvps_avx(auVar23,auVar47,auVar43);
                auVar47 = vpcmpgtd_avx(auVar23,auVar27);
                auVar43 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar23,auVar27,auVar43);
                auVar27 = vblendvps_avx(auVar27,auVar23,auVar43);
                *pauVar19 = auVar27;
                pauVar19[1] = auVar47;
                uVar15 = auVar33._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar4 = 0;
                for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  lVar4 = lVar4 + 1;
                }
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)(uVar16 + lVar4 * 8);
                auVar48 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_1148 + lVar4 * 4)));
                auVar43 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar33,auVar27,auVar43);
                auVar27 = vblendvps_avx(auVar27,auVar33,auVar43);
                auVar33 = vpcmpgtd_avx(auVar48,auVar47);
                auVar43 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar48,auVar47,auVar43);
                auVar47 = vblendvps_avx(auVar47,auVar48,auVar43);
                auVar43 = vpcmpgtd_avx(auVar47,auVar27);
                auVar48 = vpshufd_avx(auVar43,0xaa);
                auVar43 = vblendvps_avx(auVar47,auVar27,auVar48);
                auVar27 = vblendvps_avx(auVar27,auVar47,auVar48);
                auVar47 = vpcmpgtd_avx(auVar33,auVar23);
                auVar48 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar33,auVar23,auVar48);
                auVar33 = vblendvps_avx(auVar23,auVar33,auVar48);
                auVar23 = vpcmpgtd_avx(auVar43,auVar33);
                auVar48 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar43,auVar33,auVar48);
                auVar33 = vblendvps_avx(auVar33,auVar43,auVar48);
                *pauVar19 = auVar27;
                pauVar19[1] = auVar33;
                pauVar19[2] = auVar23;
                uVar15 = auVar47._0_8_;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
        }
        local_1138._0_8_ = pauVar19;
        (**(code **)((long)local_1118->leafIntersector +
                    (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_1110)
        ;
        auVar65 = ZEXT1664(local_1108);
        auVar64 = ZEXT1664(local_10f8);
        auVar62 = ZEXT1664(local_10e8);
        auVar60 = ZEXT1664(local_10d8);
        auVar59 = ZEXT1664(local_10c8);
        auVar54 = ZEXT1664(local_10b8);
        auVar57 = ZEXT1664(local_10a8);
        fVar25 = (local_1120->super_RayK<1>).tfar;
        auVar24 = ZEXT1664(CONCAT412(fVar25,CONCAT48(fVar25,CONCAT44(fVar25,fVar25))));
        ray = local_1120;
        pauVar19 = (undefined1 (*) [16])local_1138._0_8_;
      }
      goto LAB_0147a027;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }